

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
cmGlobalGenerator::GetGeneratorTarget(cmGlobalGenerator *this,cmTarget *t)

{
  cmake *this_00;
  Snapshot snapshot;
  bool bVar1;
  pointer ppVar2;
  PositionType local_c0;
  Snapshot local_b0;
  cmListFileBacktrace local_98;
  allocator local_51;
  string local_50;
  _Self local_30;
  _Self local_28;
  const_iterator ti;
  cmTarget *t_local;
  cmGlobalGenerator *this_local;
  
  ti._M_node = (_Base_ptr)t;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
       ::find(&this->GeneratorTargets,(key_type *)&ti);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
       ::end(&this->GeneratorTargets);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_00 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,"Missing cmGeneratorTarget instance!",&local_51);
    cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_c0);
    cmState::Snapshot::Snapshot(&local_b0,(cmState *)0x0,local_c0);
    snapshot.Position.Tree = local_b0.Position.Tree;
    snapshot.State = local_b0.State;
    snapshot.Position.Position = local_b0.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_98,snapshot);
    cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_50,&local_98);
    cmListFileBacktrace::~cmListFileBacktrace(&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    this_local = (cmGlobalGenerator *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>::
             operator->(&local_28);
    this_local = (cmGlobalGenerator *)ppVar2->second;
  }
  return (cmGeneratorTarget *)this_local;
}

Assistant:

cmGeneratorTarget*
cmGlobalGenerator::GetGeneratorTarget(cmTarget const* t) const
{
  cmGeneratorTargetsType::const_iterator ti = this->GeneratorTargets.find(t);
  if(ti == this->GeneratorTargets.end())
    {
    this->CMakeInstance->IssueMessage(
      cmake::INTERNAL_ERROR, "Missing cmGeneratorTarget instance!");
    return 0;
    }
  return ti->second;
}